

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_frame_codec.c
# Opt level: O1

SASL_FRAME_CODEC_HANDLE
sasl_frame_codec_create
          (FRAME_CODEC_HANDLE frame_codec,ON_SASL_FRAME_RECEIVED on_sasl_frame_received,
          ON_SASL_FRAME_CODEC_ERROR on_sasl_frame_codec_error,void *callback_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  SASL_FRAME_CODEC_HANDLE callback_context_00;
  AMQPVALUE_DECODER_HANDLE pAVar3;
  
  if ((on_sasl_frame_received == (ON_SASL_FRAME_RECEIVED)0x0 ||
      frame_codec == (FRAME_CODEC_HANDLE)0x0) ||
      on_sasl_frame_codec_error == (ON_SASL_FRAME_CODEC_ERROR)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                ,"sasl_frame_codec_create",0xa7,1,
                "Bad arguments: frame_codec = %p, on_sasl_frame_received = %p, on_sasl_frame_codec_error = %p"
                ,frame_codec,on_sasl_frame_received,on_sasl_frame_codec_error);
      return (SASL_FRAME_CODEC_HANDLE)0x0;
    }
  }
  else {
    callback_context_00 = (SASL_FRAME_CODEC_HANDLE)calloc(1,0x38);
    if (callback_context_00 == (SASL_FRAME_CODEC_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                  ,"sasl_frame_codec_create",0xb0,1,"Cannot allocate memory for SASL frame codec");
        return (SASL_FRAME_CODEC_HANDLE)0x0;
      }
    }
    else {
      callback_context_00->frame_codec = frame_codec;
      callback_context_00->on_sasl_frame_received = on_sasl_frame_received;
      callback_context_00->on_sasl_frame_codec_error = on_sasl_frame_codec_error;
      callback_context_00->callback_context = callback_context;
      callback_context_00->decode_state = SASL_FRAME_DECODE_FRAME;
      pAVar3 = amqpvalue_decoder_create(amqp_value_decoded,callback_context_00);
      callback_context_00->decoder = pAVar3;
      if (pAVar3 == (AMQPVALUE_DECODER_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                    ,"sasl_frame_codec_create",0xbf,1,"Cannot create AMQP value decoder");
        }
      }
      else {
        iVar1 = frame_codec_subscribe(frame_codec,'\x01',frame_received,callback_context_00);
        if (iVar1 == 0) {
          return callback_context_00;
        }
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                    ,"sasl_frame_codec_create",0xca,1,"Cannot subscribe for SASL frames");
        }
        amqpvalue_decoder_destroy(callback_context_00->decoder);
      }
      free(callback_context_00);
    }
  }
  return (SASL_FRAME_CODEC_HANDLE)0x0;
}

Assistant:

SASL_FRAME_CODEC_HANDLE sasl_frame_codec_create(FRAME_CODEC_HANDLE frame_codec, ON_SASL_FRAME_RECEIVED on_sasl_frame_received, ON_SASL_FRAME_CODEC_ERROR on_sasl_frame_codec_error, void* callback_context)
{
    SASL_FRAME_CODEC_INSTANCE* result;

    /* Codes_SRS_SASL_FRAME_CODEC_01_019: [If any of the arguments frame_codec, on_sasl_frame_received or on_sasl_frame_codec_error is NULL, sasl_frame_codec_create shall return NULL.] */
    if ((frame_codec == NULL) ||
        (on_sasl_frame_received == NULL) ||
        (on_sasl_frame_codec_error == NULL))
    {
        LogError("Bad arguments: frame_codec = %p, on_sasl_frame_received = %p, on_sasl_frame_codec_error = %p",
            frame_codec, on_sasl_frame_received, on_sasl_frame_codec_error);
        result = NULL;
    }
    else
    {
        /* Codes_SRS_SASL_FRAME_CODEC_01_018: [sasl_frame_codec_create shall create an instance of an sasl_frame_codec and return a non-NULL handle to it.] */
        result = (SASL_FRAME_CODEC_INSTANCE*)calloc(1, sizeof(SASL_FRAME_CODEC_INSTANCE));
        if (result == NULL)
        {
            LogError("Cannot allocate memory for SASL frame codec");
        }
        else
        {
            result->frame_codec = frame_codec;
            result->on_sasl_frame_received = on_sasl_frame_received;
            result->on_sasl_frame_codec_error = on_sasl_frame_codec_error;
            result->callback_context = callback_context;
            result->decode_state = SASL_FRAME_DECODE_FRAME;

            /* Codes_SRS_SASL_FRAME_CODEC_01_022: [sasl_frame_codec_create shall create a decoder to be used for decoding SASL values.] */
            result->decoder = amqpvalue_decoder_create(amqp_value_decoded, result);
            if (result->decoder == NULL)
            {
                /* Codes_SRS_SASL_FRAME_CODEC_01_023: [If creating the decoder fails, sasl_frame_codec_create shall fail and return NULL.] */
                LogError("Cannot create AMQP value decoder");
                free(result);
                result = NULL;
            }
            else
            {
                /* Codes_SRS_SASL_FRAME_CODEC_01_020: [sasl_frame_codec_create shall subscribe for SASL frames with the given frame_codec.] */
                /* Codes_SRS_SASL_FRAME_CODEC_01_001: [A SASL frame has a type code of 0x01.] */
                if (frame_codec_subscribe(frame_codec, FRAME_TYPE_SASL, frame_received, result) != 0)
                {
                    /* Codes_SRS_SASL_FRAME_CODEC_01_021: [If subscribing for SASL frames fails, sasl_frame_codec_create shall fail and return NULL.] */
                    LogError("Cannot subscribe for SASL frames");
                    amqpvalue_decoder_destroy(result->decoder);
                    free(result);
                    result = NULL;
                }
            }
        }
    }

    return result;
}